

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC UINT32_Unmarshal(UINT32 *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC local_24;
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  UINT32 *target_local;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  if (iVar1 + -4 < 0) {
    local_24 = 0x9a;
  }
  else {
    UVar2 = ByteArrayToUint32(*buffer);
    *target = UVar2;
    *buffer = *buffer + 4;
    local_24 = 0;
  }
  return local_24;
}

Assistant:

TPM_RC UINT32_Unmarshal(UINT32 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 4) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT32(*buffer);
        *buffer += 4;
        result = TPM_RC_SUCCESS;
    }
    return result;
}